

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_ResizeDecodeCache(FAudio *audio,uint32_t samples)

{
  undefined8 uVar1;
  uint in_ESI;
  long in_RDI;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x12e92b);
  if (*(uint *)(in_RDI + 0x90) < in_ESI) {
    *(uint *)(in_RDI + 0x90) = in_ESI;
    uVar1 = (**(code **)(in_RDI + 200))
                      (*(undefined8 *)(in_RDI + 0xa0),(ulong)*(uint *)(in_RDI + 0x90) << 2);
    *(undefined8 *)(in_RDI + 0xa0) = uVar1;
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12e993);
  return;
}

Assistant:

void FAudio_INTERNAL_ResizeDecodeCache(FAudio *audio, uint32_t samples)
{
	LOG_FUNC_ENTER(audio)
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	if (samples > audio->decodeSamples)
	{
		audio->decodeSamples = samples;
		audio->decodeCache = (float*) audio->pRealloc(
			audio->decodeCache,
			sizeof(float) * audio->decodeSamples
		);
	}
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)
	LOG_FUNC_EXIT(audio)
}